

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O2

_Bool binary_fuse8_allocate(uint32_t size,binary_fuse8_t *filter)

{
  uint32_t uVar1;
  int iVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint size_00;
  double dVar5;
  
  filter->Size = size;
  if (size == 0) {
    size_00 = 4;
  }
  else {
    uVar1 = binary_fuse_calculate_segment_length(size,(uint32_t)filter);
    size_00 = 0x40000;
    if (uVar1 < 0x40000) {
      size_00 = uVar1;
    }
  }
  filter->SegmentLength = size_00;
  uVar1 = size_00 - 1;
  filter->SegmentLengthMask = uVar1;
  iVar2 = 0;
  if (1 < size) {
    dVar5 = binary_fuse_calculate_size_factor(size,size_00);
    dVar5 = round(dVar5 * (double)size);
    iVar2 = (int)(long)dVar5;
    size_00 = filter->SegmentLength;
    uVar1 = size_00 - 1;
  }
  uVar4 = (size_00 + iVar2) - 1;
  uVar4 = ((uVar4 - uVar4 % size_00) + uVar1) / size_00;
  uVar1 = 1;
  if (2 < uVar4) {
    uVar1 = uVar4 - 2;
  }
  filter->SegmentCount = uVar1;
  uVar4 = (uVar1 + 2) * size_00;
  filter->ArrayLength = uVar4;
  filter->SegmentCountLength = uVar1 * size_00;
  puVar3 = (uint8_t *)calloc((ulong)uVar4,1);
  filter->Fingerprints = puVar3;
  return puVar3 != (uint8_t *)0x0;
}

Assistant:

static inline bool binary_fuse8_allocate(uint32_t size,
                                         binary_fuse8_t *filter) {
  uint32_t arity = 3;
  filter->Size = size;
  filter->SegmentLength = size == 0 ? 4 : binary_fuse_calculate_segment_length(arity, size);
  if (filter->SegmentLength > 262144) {
    filter->SegmentLength = 262144;
  }
  filter->SegmentLengthMask = filter->SegmentLength - 1;
  double sizeFactor = size <= 1 ? 0 : binary_fuse_calculate_size_factor(arity, size);
  uint32_t capacity = size <= 1 ? 0 : (uint32_t)(round((double)size * sizeFactor));
  uint32_t initSegmentCount =
      (capacity + filter->SegmentLength - 1) / filter->SegmentLength -
      (arity - 1);
  filter->ArrayLength = (initSegmentCount + arity - 1) * filter->SegmentLength;
  filter->SegmentCount =
      (filter->ArrayLength + filter->SegmentLength - 1) / filter->SegmentLength;
  if (filter->SegmentCount <= arity - 1) {
    filter->SegmentCount = 1;
  } else {
    filter->SegmentCount = filter->SegmentCount - (arity - 1);
  }
  filter->ArrayLength =
      (filter->SegmentCount + arity - 1) * filter->SegmentLength;
  filter->SegmentCountLength = filter->SegmentCount * filter->SegmentLength;
  filter->Fingerprints =
      (uint8_t *)calloc(filter->ArrayLength, sizeof(uint8_t));
  return filter->Fingerprints != NULL;
}